

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O2

void __thiscall
CombinedH264Demuxer::setFileIterator(CombinedH264Demuxer *this,FileNameIterator *itr)

{
  BufferedReader *this_00;
  undefined4 *puVar1;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  ostringstream ss;
  
  this_00 = (BufferedReader *)this->m_bufferedReader;
  if ((this_00 != (BufferedReader *)0x0) &&
     ((this_00->super_AbstractReader)._vptr_AbstractReader ==
      (_func_int **)&PTR__BufferedReader_00249e70)) {
    BufferedReader::setFileIterator(this_00,itr,this->m_readerID);
    return;
  }
  if (itr == (FileNameIterator *)0x0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  std::operator<<((ostream *)&ss,
                  "Can not set file iterator. Reader does not support bufferedReader interface.");
  puVar1 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar1 = 3;
  *(undefined4 **)(puVar1 + 2) = puVar1 + 6;
  if (local_1a8 == &local_198) {
    puVar1[6] = local_198;
    puVar1[7] = uStack_194;
    puVar1[8] = uStack_190;
    puVar1[9] = uStack_18c;
  }
  else {
    *(uint **)(puVar1 + 2) = local_1a8;
    *(ulong *)(puVar1 + 6) = CONCAT44(uStack_194,local_198);
  }
  *(undefined8 *)(puVar1 + 4) = local_1a0;
  local_198 = local_198 & 0xffffff00;
  __cxa_throw(puVar1,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void CombinedH264Demuxer::setFileIterator(FileNameIterator* itr)
{
    const auto br = dynamic_cast<BufferedFileReader*>(m_bufferedReader);
    if (br)
        br->setFileIterator(itr, m_readerID);
    else if (itr != nullptr)
        THROW(ERR_COMMON, "Can not set file iterator. Reader does not support bufferedReader interface.")
}